

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

int sortforremap2(void *a,void *b)

{
  RemappingWork *bp;
  RemappingWork *ap;
  void *b_local;
  void *a_local;
  
  if (*a == *b) {
    a_local._4_4_ = (uint)*(byte *)((long)b + 4) - (uint)*(byte *)((long)a + 4);
  }
  else {
    a_local._4_4_ = *a - *b;
  }
  return a_local._4_4_;
}

Assistant:

static int sortforremap2 (const void *a, const void *b)
{
	const RemappingWork *ap = (const RemappingWork *)a;
	const RemappingWork *bp = (const RemappingWork *)b;

	if (ap->Color == bp->Color)
	{
		return bp->Foreign - ap->Foreign;
	}
	else
	{
		return ap->Color - bp->Color;
	}
}